

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

void __thiscall
pbrt::ParallelForLoop1D::RunStep(ParallelForLoop1D *this,unique_lock<std::mutex> *lock)

{
  long __args;
  _func_int **pp_Var1;
  int iVar2;
  long __args_1;
  
  __args = this->nextIndex;
  pp_Var1 = (this->super_ParallelJob)._vptr_ParallelJob;
  __args_1 = this->chunkSize + __args;
  if (this->endIndex < __args_1) {
    __args_1 = this->endIndex;
  }
  this->nextIndex = __args_1;
  iVar2 = (*pp_Var1[2])();
  if ((char)iVar2 == '\0') {
    ThreadPool::RemoveFromJobList(threadPool,&this->super_ParallelJob);
  }
  std::unique_lock<std::mutex>::unlock(lock);
  std::function<void_(long,_long)>::operator()(&this->func,__args,__args_1);
  return;
}

Assistant:

void ParallelForLoop1D::RunStep(std::unique_lock<std::mutex> *lock) {
    // Determine the range of loop iterations to run in this step
    int64_t indexStart = nextIndex;
    int64_t indexEnd = std::min(indexStart + chunkSize, endIndex);
    nextIndex = indexEnd;

    // Remove job from list if all work has been started
    if (!HaveWork())
        threadPool->RemoveFromJobList(this);

    // Release lock and execute loop iterations in _[indexStart, indexEnd)_
    lock->unlock();
    func(indexStart, indexEnd);
}